

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O2

void deqp::gls::BuiltinPrecisionTests::
     ContainerTraits<tcu::Vector<int,_3>,_tcu::Vector<tcu::Interval,_3>_>::doPrintValue
               (FloatFormat *fmt,Vector<int,_3> *value,ostream *os)

{
  char *pcVar1;
  ostream *poVar2;
  int ndx;
  long lVar3;
  
  pcVar1 = dataTypeNameOf<tcu::Vector<int,3>>();
  poVar2 = std::operator<<(os,pcVar1);
  std::operator<<(poVar2,"(");
  lVar3 = 0;
  do {
    if (lVar3 != 0) {
      if (lVar3 == 3) {
        std::operator<<(os,")");
        return;
      }
      std::operator<<(os,", ");
    }
    std::ostream::operator<<(os,value->m_data[lVar3]);
    lVar3 = lVar3 + 1;
  } while( true );
}

Assistant:

static void			doPrintValue	(const FloatFormat& fmt, const T& value, ostream& os)
	{
		os << dataTypeNameOf<T>() << "(";

		for (int ndx = 0; ndx < T::SIZE; ++ndx)
		{
			if (ndx > 0)
				os << ", ";

			printValue<Element>(fmt, value[ndx], os);
		}

		os << ")";
	}